

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int HistoQueueInit(HistoQueue *histo_queue,int max_size)

{
  HistogramPair *pHVar1;
  
  histo_queue->size = 0;
  histo_queue->max_size = max_size;
  pHVar1 = (HistogramPair *)WebPSafeMalloc((long)(max_size + 1),0x40);
  histo_queue->queue = pHVar1;
  return (int)(pHVar1 != (HistogramPair *)0x0);
}

Assistant:

static int HistoQueueInit(HistoQueue* const histo_queue, const int max_size) {
  histo_queue->size = 0;
  histo_queue->max_size = max_size;
  // We allocate max_size + 1 because the last element at index "size" is
  // used as temporary data (and it could be up to max_size).
  histo_queue->queue = (HistogramPair*)WebPSafeMalloc(
      histo_queue->max_size + 1, sizeof(*histo_queue->queue));
  return histo_queue->queue != NULL;
}